

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

string * deqp::gles3::Performance::toStringWithPadding<unsigned_int>
                   (string *__return_storage_ptr__,uint value,int minLength)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  ostringstream local_190 [8];
  ostringstream s;
  int minLength_local;
  uint value_local;
  
  s._368_4_ = minLength;
  s._372_4_ = value;
  std::__cxx11::ostringstream::ostringstream(local_190);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(local_190,_Var1._M_c);
  _Var2 = std::setw(s._368_4_);
  poVar3 = std::operator<<(poVar3,_Var2);
  std::ostream::operator<<(poVar3,s._372_4_);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

inline string toStringWithPadding (T value, int minLength)
{
	std::ostringstream s;
	s << std::setfill('0') << std::setw(minLength) << value;
	return s.str();
}